

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

void __thiscall SQLexer::Next(SQLexer *this)

{
  SQInteger SVar1;
  
  SVar1 = (*this->_readf)(this->_up);
  if (SVar1 < 0x100) {
    if (SVar1 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
      return;
    }
  }
  else {
    (*this->_errfunc)(this->_errtarget,"Invalid character");
  }
  this->_currdata = (LexChar)SVar1;
  return;
}

Assistant:

void SQLexer::Next()
{
    SQInteger t = _readf(_up);
    if(t > MAX_CHAR) Error(_SC("Invalid character"));
    if(t != 0) {
        _currdata = (LexChar)t;
        return;
    }
    _currdata = SQUIRREL_EOB;
    _reached_eof = SQTrue;
}